

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_dd81ad::KeyConverter::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          KeyConverter *this,CPubKey *key)

{
  long lVar1;
  byte bVar2;
  allocator_type *__a;
  uchar *__last;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  allocator_type local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_script_ctx == P2WSH) {
    lVar1 = 0x21;
    if ((key->vch[0] & 0xfe) != 2) {
      bVar2 = key->vch[0] - 4;
      if (bVar2 < 4) {
        lVar1 = (&DAT_00e5ea00)[bVar2];
      }
      else {
        lVar1 = 0;
      }
    }
    __last = key->vch + lVar1;
    __a = (allocator_type *)&stack0xffffffffffffffc8;
  }
  else {
    if (this->m_script_ctx != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    local_38 = *(undefined8 *)(key->vch + 1);
    uStack_30 = *(undefined8 *)(key->vch + 9);
    local_28 = *(undefined8 *)(key->vch + 0x11);
    uStack_20 = *(undefined8 *)(key->vch + 0x19);
    __last = &stack0xffffffffffffffe8;
    key = (CPubKey *)&stack0xffffffffffffffc8;
    __a = &local_39;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,key->vch,
             __last,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const CPubKey& key) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {key.begin(), key.end()};
        }
        const XOnlyPubKey xonly_pubkey{key};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }